

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.h
# Opt level: O1

void __thiscall
argParserAdvancedConfiguration::argument::argument
          (argument *this,string *argS,string *argL,string *helpMessage,function<void_()> *lambda_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->argShort).field_2;
  (this->argShort)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (argS->_M_dataplus)._M_p;
  paVar2 = &argS->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&argS->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->argShort).field_2 + 8) = uVar4;
  }
  else {
    (this->argShort)._M_dataplus._M_p = pcVar3;
    (this->argShort).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->argShort)._M_string_length = argS->_M_string_length;
  (argS->_M_dataplus)._M_p = (pointer)paVar2;
  argS->_M_string_length = 0;
  (argS->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->argLong).field_2;
  (this->argLong)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (argL->_M_dataplus)._M_p;
  paVar2 = &argL->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&argL->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->argLong).field_2 + 8) = uVar4;
  }
  else {
    (this->argLong)._M_dataplus._M_p = pcVar3;
    (this->argLong).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->argLong)._M_string_length = argL->_M_string_length;
  (argL->_M_dataplus)._M_p = (pointer)paVar2;
  argL->_M_string_length = 0;
  (argL->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->helpMessage).field_2;
  (this->helpMessage)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (helpMessage->_M_dataplus)._M_p;
  paVar2 = &helpMessage->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&helpMessage->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->helpMessage).field_2 + 8) = uVar4;
  }
  else {
    (this->helpMessage)._M_dataplus._M_p = pcVar3;
    (this->helpMessage).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->helpMessage)._M_string_length = helpMessage->_M_string_length;
  (helpMessage->_M_dataplus)._M_p = (pointer)paVar2;
  helpMessage->_M_string_length = 0;
  (helpMessage->field_2)._M_local_buf[0] = '\0';
  (this->additionalHelp)._M_dataplus._M_p = (pointer)&(this->additionalHelp).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->additionalHelp,"");
  (this->enums)._M_dataplus._M_p = (pointer)&(this->enums).field_2;
  (this->enums)._M_string_length = 0;
  (this->enums).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->callBack).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callBack).super__Function_base._M_functor + 8) = 0;
  (this->callBack).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callBack)._M_invoker = (_Invoker_type)0x0;
  std::function<void_()>::function(&this->simpleCallBack,lambda_);
  this->requiredAndNotHitJet = false;
  this->numberOfArguments = -1;
  return;
}

Assistant:

argument(string argS, string argL, string helpMessage, function<void()> lambda_) : argLong(
                std::move(argL)), argShort(std::move(argS)), simpleCallBack(lambda_), helpMessage(
                std::move(helpMessage)) {}